

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

bool google::GetCommandLineOption(char *name,string *value)

{
  Mutex *pMVar1;
  int iVar2;
  FlagRegistry *this;
  CommandLineFlag *pCVar3;
  bool bVar4;
  string local_40;
  
  if (name == (char *)0x0) {
    bVar4 = false;
  }
  else {
    if (value == (string *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x624,"bool google::GetCommandLineOption(const char *, string *)");
    }
    this = anon_unknown_1::FlagRegistry::GlobalRegistry();
    pMVar1 = &this->lock_;
    iVar2 = pMVar1->mutex_;
    pMVar1->mutex_ = pMVar1->mutex_ + -1;
    if (iVar2 != 0) {
      __assert_fail("--mutex_ == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                    ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
    }
    pCVar3 = anon_unknown_1::FlagRegistry::FindFlagLocked(this,name);
    bVar4 = pCVar3 != (CommandLineFlag *)0x0;
    if (bVar4) {
      (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_40,pCVar3->current_);
      std::__cxx11::string::operator=((string *)value,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    pMVar1 = &this->lock_;
    pMVar1->mutex_ = pMVar1->mutex_ + 1;
    if (pMVar1->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                    ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
    }
  }
  return bVar4;
}

Assistant:

bool GetCommandLineOption(const char* name, string* value) {
  if (NULL == name)
    return false;
  assert(value);

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag == NULL) {
    return false;
  } else {
    *value = flag->current_value();
    return true;
  }
}